

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O1

void __thiscall
Vocabulary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Vocabulary(Vocabulary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *words)

{
  BooPHF *this_00;
  size_t __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  string *psVar2;
  pointer pbVar3;
  pointer pbVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  ulong uVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  size_t sVar7;
  uint64_t uVar8;
  long lVar9;
  ulong uVar10;
  size_type __n_00;
  pointer pcVar11;
  ptrdiff_t _Num;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hasher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_words;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reordered_words;
  allocator_type local_30a;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_309;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2d8;
  string *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> local_2c0;
  
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_dump_00150d48;
  local_2d0 = &this->data;
  local_2c8 = &(this->data).field_2;
  (this->data)._M_dataplus._M_p = (pointer)local_2c8;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  local_2d8 = &this->offsets;
  (this->offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->mphf;
  boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::mphf(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_308,words);
  pbVar4 = local_308.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = local_308.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar5 = (long)local_308.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_308.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar9 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_308.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_308.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar3,pbVar4);
  }
  _Var6 = std::
          __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (local_308.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_308.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&local_308,
           (long)_Var6._M_current -
           (long)local_308.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  __n_00 = (long)local_308.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_308.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (0xfffffffe < __n_00) {
    __assert_fail("unique_words.size() < (~uint32_t(0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/Vocabulary.h"
                  ,0x82,"Vocabulary<std::basic_string<char>>::Vocabulary(const vector<string> &)");
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_2f0,__n_00,(allocator_type *)&local_2c0);
  if (local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar5 = 0;
    do {
      sVar7 = std::
              hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(&local_309,
                           (string *)
                           ((long)&((local_308.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar9));
      local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = sVar7;
      uVar5 = uVar5 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar5 < (ulong)((long)local_308.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_308.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2c0._levels.super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
    if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&local_2f0,
                 (iterator)
                 local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,(unsigned_long *)&local_2c0);
    }
    else {
      *local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = 0xffffffffffffffff;
      local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
  mphf<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *)&local_2c0,
             (long)local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_2f0,8,2.0,true,false,0.03);
  std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator=
            (&this_00->_levels,&local_2c0._levels);
  memcpy(&(this->mphf)._nb_levels,&local_2c0._nb_levels,0x88);
  if (&local_2c0 != this_00) {
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,boomphf::SingleHashFunctor<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,boomphf::SingleHashFunctor<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,boomphf::SingleHashFunctor<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->mphf)._final_hash,&local_2c0._final_hash._M_h);
  }
  (this->mphf)._progressBar.heure_actuelle = local_2c0._progressBar.heure_actuelle;
  (this->mphf)._progressBar.timestamp.tv_usec = local_2c0._progressBar.timestamp.tv_usec;
  (this->mphf)._progressBar.heure_debut = local_2c0._progressBar.heure_debut;
  (this->mphf)._progressBar.timer_mode = local_2c0._progressBar.timer_mode;
  *(undefined4 *)&(this->mphf)._progressBar.field_0x4 = local_2c0._progressBar._4_4_;
  (this->mphf)._progressBar.timestamp.tv_sec = local_2c0._progressBar.timestamp.tv_sec;
  std::__cxx11::string::_M_assign((string *)&(this->mphf)._progressBar.message);
  (this->mphf)._progressBar._nthreads = local_2c0._progressBar._nthreads;
  (this->mphf)._progressBar.subdiv = local_2c0._progressBar.subdiv;
  *(undefined4 *)&(this->mphf)._progressBar.field_0x5c = local_2c0._progressBar._92_4_;
  (this->mphf)._progressBar.partial = local_2c0._progressBar.partial;
  (this->mphf)._progressBar.done = local_2c0._progressBar.done;
  (this->mphf)._progressBar.todo = local_2c0._progressBar.todo;
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->mphf)._progressBar.partial_threaded,&local_2c0._progressBar.partial_threaded);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(this->mphf)._progressBar.done_threaded,&local_2c0._progressBar.done_threaded);
  (this->mphf)._progressBar.steps = local_2c0._progressBar.steps;
  (this->mphf)._nb_living = local_2c0._nb_living;
  (this->mphf)._num_thread = local_2c0._num_thread;
  (this->mphf)._hashidx = local_2c0._hashidx;
  (this->mphf)._proba_collision = local_2c0._proba_collision;
  (this->mphf)._lastbitsetrank = local_2c0._lastbitsetrank;
  (this->mphf)._idxLevelsetLevelFastmode = local_2c0._idxLevelsetLevelFastmode;
  (this->mphf)._cptLevel = CONCAT35(local_2c0._cptLevel._5_3_,(undefined5)local_2c0._cptLevel);
  *(ulong *)((long)&(this->mphf)._cptLevel + 5) =
       CONCAT53((undefined5)local_2c0._cptTotalProcessed,local_2c0._cptLevel._5_3_);
  *(undefined8 *)((long)&(this->mphf)._cptTotalProcessed + 5) = local_2c0._533_8_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(this->mphf).setLevelFastmode,&local_2c0.setLevelFastmode);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator=(&(this->mphf).bufferperThread,&local_2c0.bufferperThread);
  (this->mphf)._mutex.__data.__list.__prev = local_2c0._mutex.__data.__list.__prev;
  (this->mphf)._mutex.__data.__list.__next = local_2c0._mutex.__data.__list.__next;
  *(undefined8 *)((long)&(this->mphf)._mutex + 8) = local_2c0._mutex._8_8_;
  *(undefined8 *)((long)&(this->mphf)._mutex + 0x10) = local_2c0._mutex._16_8_;
  (this->mphf)._pid = local_2c0._pid;
  *(undefined4 *)&(this->mphf).field_0x264 = local_2c0._612_4_;
  (this->mphf)._mutex.__align = local_2c0._mutex.__align;
  (this->mphf)._fastModeLevel = local_2c0._fastModeLevel;
  (this->mphf)._withprogress = local_2c0._withprogress;
  (this->mphf)._built = local_2c0._built;
  (this->mphf)._writeEachLevel = local_2c0._writeEachLevel;
  (this->mphf).field_0x257 = local_2c0._599_1_;
  (this->mphf)._currlevelFile = local_2c0._currlevelFile;
  boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::~mphf(&local_2c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_2c0,
           (long)local_308.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_308.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,&local_30a);
  if (local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    pvVar1 = local_2d8;
    psVar2 = local_2d0;
  }
  else {
    lVar9 = 0;
    uVar5 = 0;
    uVar10 = 0;
    do {
      uVar8 = boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::lookup
                        (this_00,local_2f0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10]);
      std::__cxx11::string::_M_assign
                ((string *)
                 (&(local_2c0._levels.
                    super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                    super__Vector_impl_data._M_start)->idx_begin + uVar8 * 4));
      uVar5 = uVar5 + *(long *)((long)&(local_308.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                               + lVar9);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x20;
      pvVar1 = local_2d8;
      psVar2 = local_2d0;
    } while (uVar10 < (ulong)((long)local_308.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_308.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  for (; this_01 = local_2d8, local_2d8 = pvVar1, local_2d0 = psVar2,
      local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
      local_308.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_308.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    pcVar11 = ((local_308.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar11 !=
        &(local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->field_2) {
      operator_delete(pcVar11);
    }
    pvVar1 = local_2d8;
    psVar2 = local_2d0;
    local_2d8 = this_01;
  }
  if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (0xfffffffe < uVar5) {
    __assert_fail("data_size < (~uint32_t(0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/Vocabulary.h"
                  ,0x95,"Vocabulary<std::basic_string<char>>::Vocabulary(const vector<string> &)");
  }
  std::__cxx11::string::resize((ulong)psVar2,(char)uVar5);
  pcVar11 = (psVar2->_M_dataplus)._M_p;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_01,((long)local_2c0._levels.
                            super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2c0._levels.
                            super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  if (local_2c0._levels.super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_2c0._levels.super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
  }
  else {
    lVar9 = 8;
    uVar10 = 0;
    do {
      (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar10] = (int)pcVar11 - *(int *)&(psVar2->_M_dataplus)._M_p;
      __n = *(size_t *)
             ((long)&(local_2c0._levels.
                      super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                      super__Vector_impl_data._M_start)->idx_begin + lVar9);
      if (__n != 0) {
        memmove(pcVar11,*(void **)((long)local_2c0._levels.
                                         super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8),__n
               );
      }
      pcVar11 = pcVar11 + __n;
      uVar10 = uVar10 + 1;
      uVar5 = (long)local_2c0._levels.
                    super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_2c0._levels.
                    super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5;
      lVar9 = lVar9 + 0x20;
    } while (uVar10 < uVar5);
  }
  (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start[uVar5] = (int)pcVar11 - *(int *)&(psVar2->_M_dataplus)._M_p;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c0);
  if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308);
  return;
}

Assistant:

Vocabulary(const vector<string> &words) {
        vector<string> unique_words(words);
        sort(unique_words.begin(), unique_words.end());
        auto it = unique(unique_words.begin(), unique_words.end());
        unique_words.resize(size_t(it - unique_words.begin()));

        assert(unique_words.size() < (~uint32_t(0)));

        std::hash<string> hasher;
        vector<uint64_t> hashes(unique_words.size());
        for (size_t i = 0; i < unique_words.size(); i++)
            hashes[i] = hasher(unique_words[i]);
        if (hashes.size() == 0) // mphf cannot be serialized if key set is empty
            hashes.push_back(ULLONG_MAX);
        mphf = BooPHF(hashes.size(), hashes, 8, 2.0, true, false);

        uint64_t data_size = 0;
        vector<string> reordered_words(unique_words.size());
        for (size_t i = 0; i < unique_words.size(); i++) {
            reordered_words[mphf.lookup(hashes[i])] = unique_words[i];
            data_size += unique_words[i].length();
        }
        unique_words.clear();
        hashes.clear();

        assert(data_size < (~uint32_t(0)));

        data.resize(data_size);
        auto data_end = data.begin();
        offsets.resize(reordered_words.size() + 1);
        for (size_t i = 0; i < reordered_words.size(); i++) {
            offsets[i] = uint32_t(data_end - data.begin());
            data_end = copy(reordered_words[i].begin(), reordered_words[i].end(), data_end);
        }
        offsets[reordered_words.size()] = uint32_t(data_end - data.begin());
    }